

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_>::
Data(Data<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_> *this,
    Data<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_> *other)

{
  byte bVar1;
  Span *pSVar2;
  Entry *pEVar3;
  Data *pDVar4;
  int *piVar5;
  Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo> *pNVar6;
  long lVar7;
  size_t sVar8;
  size_t sVar9;
  R RVar10;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar8 = other->numBuckets;
  sVar9 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar9;
  this->spans = (Span *)0x0;
  RVar10 = allocateSpans(sVar8);
  this->spans = (Span *)RVar10.spans;
  if (RVar10.nSpans != 0) {
    lVar7 = 0;
    sVar8 = 0;
    do {
      pSVar2 = other->spans;
      sVar9 = 0;
      do {
        bVar1 = pSVar2->offsets[sVar9 + lVar7];
        if (bVar1 != 0xff) {
          pEVar3 = pSVar2[sVar8].entries;
          pNVar6 = Span<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_>
                   ::insert(this->spans + sVar8,sVar9);
          pNVar6->key = *(QNetworkReply **)pEVar3[bVar1].storage.data;
          pDVar4 = *(Data **)(pEVar3[bVar1].storage.data + 8);
          (pNVar6->value).contextObject.wp.d = pDVar4;
          (pNVar6->value).contextObject.wp.value = *(QObject **)(pEVar3[bVar1].storage.data + 0x10);
          if (pDVar4 != (Data *)0x0) {
            LOCK();
            (pDVar4->weakref)._q_value.super___atomic_base<int>._M_i =
                 (pDVar4->weakref)._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          piVar5 = *(int **)(pEVar3[bVar1].storage.data + 0x18);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + 1;
            UNLOCK();
          }
          (pNVar6->value).slot.obj._M_t.
          super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>.
          _M_t.
          super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
          super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl =
               *(QSlotObjectBase **)(pEVar3[bVar1].storage.data + 0x18);
        }
        sVar9 = sVar9 + 1;
      } while (sVar9 != 0x80);
      sVar8 = sVar8 + 1;
      lVar7 = lVar7 + 0x90;
    } while (sVar8 != RVar10.nSpans);
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }